

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

size_t cs_impl::hash_if<cs::structure,_cs::structure,_false>::hash(structure *val)

{
  error *this;
  allocator local_31;
  string local_30;
  
  this = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E000F",&local_31);
  cov::error::error(this,&local_30);
  __cxa_throw(this,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

static std::size_t hash(const X &val)
		{
			throw cov::error("E000F");
		}